

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * Catch::(anonymous_namespace)::escape_abi_cxx11_(StringRef str)

{
  string *in_RDI;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  StringRef local_20;
  
  StringRef::operator_cast_to_string(in_RDI,&local_20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"|",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"||",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\'",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"|\'",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\n",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"|n",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\r",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"|r",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"[",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"|[",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"]",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"|]",&local_62);
  replaceInPlace(in_RDI,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

std::string escape(StringRef str) {
            std::string escaped = static_cast<std::string>(str);
            replaceInPlace(escaped, "|", "||");
            replaceInPlace(escaped, "'", "|'");
            replaceInPlace(escaped, "\n", "|n");
            replaceInPlace(escaped, "\r", "|r");
            replaceInPlace(escaped, "[", "|[");
            replaceInPlace(escaped, "]", "|]");
            return escaped;
        }